

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall GlobOpt::ValueNumberLdElemDst(GlobOpt *this,Instr **pInstr,Value *srcVal)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  ObjectType OVar4;
  uint uVar5;
  uint uVar6;
  BailOutKind BVar7;
  BailOutKind BVar8;
  BailOutKind BVar9;
  ProfiledInstr *pPVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar11;
  Opnd *pOVar12;
  RegOpnd *pRVar13;
  JITTimeFunctionBody *pJVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  char16 *pcVar17;
  undefined4 *puVar18;
  ValueInfo *this_00;
  ValueType *this_01;
  char16_t *pcVar19;
  char16_t *local_478;
  ValueInfo *local_448;
  char local_438 [8];
  char dstValTypeStr [256];
  char baseValueTypeStr_1 [256];
  char16 debugStringBuffer_1 [42];
  BailOutKind oldBailOutKind_1;
  BailOutKind oldBailOutKind;
  char local_1cb;
  BailOutKind bailOutKind;
  IRType toType;
  char baseValueTypeStr [256];
  char16 debugStringBuffer [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6a;
  IndirOpnd *pIStack_68;
  ValueType baseValueType;
  IndirOpnd *src;
  ValueInfo *pVStack_58;
  ValueType profiledElementType;
  ValueInfo *srcValueInfo;
  int32 newMax;
  int32 newMin;
  Value *dstVal;
  Opnd *dst;
  Instr **instr;
  Value *srcVal_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  dst = (Opnd *)pInstr;
  instr = (Instr **)srcVal;
  srcVal_local = (Value *)pInstr;
  pInstr_local = (Instr **)this;
  dstVal = (Value *)IR::Instr::GetDst(*pInstr);
  _newMax = (Value *)0x0;
  if (instr == (Instr **)0x0) {
    local_448 = (ValueInfo *)0x0;
  }
  else {
    local_448 = ::Value::GetValueInfo((Value *)instr);
  }
  pVStack_58 = local_448;
  ValueType::ValueType((ValueType *)((long)&src + 6));
  bVar3 = IR::Instr::IsProfiledInstr((Instr *)dst->_vptr_Opnd);
  if (bVar3) {
    pPVar10 = IR::Instr::AsProfiledInstr((Instr *)dst->_vptr_Opnd);
    src._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                Js::LdElemInfo::GetElementType((pPVar10->u).ldElemInfo);
    src._6_2_ = src._4_2_;
    bVar3 = ValueType::IsLikelyInt((ValueType *)((long)&src + 6));
    if ((((!bVar3) || (bVar3 = IR::Opnd::IsRegOpnd((Opnd *)dstVal), !bVar3)) ||
        (pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)dstVal),
        (*(uint *)&pRVar13->m_sym->field_0x18 >> 1 & 1) == 0)) &&
       ((instr != (Instr **)0x0 &&
        (bVar3 = ValueType::IsUninitialized(&pVStack_58->super_ValueType), bVar3)))) {
      bVar3 = IsLoopPrePass(this);
      if (bVar3) {
        src._2_2_ = src._6_2_;
        _newMax = NewGenericValue(this,(ValueType)src._6_2_,(Opnd *)dstVal);
      }
      else {
        paVar11 = &ValueInfo::Type(pVStack_58)->field_0;
        paVar11->field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)src._6_2_;
        pOVar12 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
        src._0_2_ = src._6_2_;
        IR::Opnd::SetValueType(pOVar12,(ValueType)src._6_2_);
      }
    }
  }
  pOVar12 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
  pIStack_68 = IR::Opnd::AsIndirOpnd(pOVar12);
  pRVar13 = IR::IndirOpnd::GetBaseOpnd(pIStack_68);
  local_6a.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRVar13->super_Opnd);
  bVar3 = IR::Instr::DoStackArgsOpt((Instr *)dst->_vptr_Opnd);
  if ((((bVar3) ||
       ((bVar3 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_6a.field_0), !bVar3 &&
        ((bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_6a.field_0), !bVar3 ||
         (bVar3 = IR::Instr::IsProfiledInstr((Instr *)dst->_vptr_Opnd), !bVar3)))))) ||
      ((bVar3 = DoTypedArrayTypeSpec(this), !bVar3 &&
       (bVar3 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_6a.field_0), bVar3)))) ||
     (((bVar3 = DoNativeArrayTypeSpec(this), !bVar3 &&
       (bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_6a.field_0), bVar3)) ||
      (bVar3 = ShouldExpectConventionalArrayIndexValue(this,pIStack_68), !bVar3)))) {
    bVar3 = DoTypedArrayTypeSpec(this);
    if ((bVar3) && (bVar3 = IsLoopPrePass(this), !bVar3)) {
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar5,uVar6);
      if (bVar3) {
        Output::Print(L"TRACE ");
        bVar3 = IsLoopPrePass(this);
        if (bVar3) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Didn\'t specialize array access.\n");
        IR::Instr::Dump((Instr *)dst->_vptr_Opnd);
        Output::Flush();
      }
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar5,uVar6);
      if (bVar3) {
        ValueType::ToString((ValueType *)&local_6a.field_0,(char (*) [256])&bailOutKind);
        pJVar14 = Func::GetJITFunctionBody(this->func);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
        pcVar16 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr + 0xf8));
        pcVar17 = Js::OpCodeUtil::GetOpCodeName(*(OpCode *)(dst->_vptr_Opnd + 6));
        bVar3 = IR::Instr::DoStackArgsOpt((Instr *)dst->_vptr_Opnd);
        if (bVar3) {
          local_478 = L"instruction uses the arguments object";
        }
        else {
          bVar3 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_6a.field_0);
          local_478 = L"of array type";
          if (bVar3) {
            local_478 = L"index is negative or likely not int";
          }
        }
        Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"
                      ,pcVar15,pcVar16,pcVar17,&bailOutKind,local_478);
        Output::Flush();
      }
    }
    if (_newMax == (Value *)0x0) {
      if (instr == (Instr **)0x0) {
        _newMax = NewGenericValue(this,(ValueType)src._6_2_,(Opnd *)dstVal);
      }
      else {
        _newMax = ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,(Value *)instr);
      }
    }
    return _newMax;
  }
  pOVar12 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
  bVar3 = IR::Opnd::IsIndirOpnd(pOVar12);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1521,"(instr->GetSrc1()->IsIndirOpnd())","instr->GetSrc1()->IsIndirOpnd()"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 0;
  }
  oldBailOutKind = BailOutConventionalTypedArrayAccessOnly;
  OVar4 = ValueType::GetObjectType((ValueType *)&local_6a.field_0);
  switch(OVar4) {
  case Int8Array:
  case Int8VirtualArray:
  case Int8MixedArray:
    srcValueInfo._4_4_ = -0x80;
    srcValueInfo._0_4_ = 0x7f;
    break;
  case Uint8Array:
  case Uint8ClampedArray:
  case Uint8VirtualArray:
  case Uint8ClampedVirtualArray:
  case Uint8MixedArray:
  case Uint8ClampedMixedArray:
    srcValueInfo._4_4_ = 0;
    srcValueInfo._0_4_ = 0xff;
    break;
  case Int16Array:
  case Int16VirtualArray:
  case Int16MixedArray:
    srcValueInfo._4_4_ = -0x8000;
    srcValueInfo._0_4_ = 0x7fff;
    break;
  case Uint16Array:
  case Uint16VirtualArray:
  case Uint16MixedArray:
    srcValueInfo._4_4_ = 0;
    srcValueInfo._0_4_ = 0xffff;
    break;
  case Int32Array:
  case Uint32Array:
  case Int32VirtualArray:
  case Uint32VirtualArray:
  case Int32MixedArray:
  case Uint32MixedArray:
    goto LAB_00594202;
  case Float32Array:
  case Float64Array:
  case Float32VirtualArray:
  case Float64VirtualArray:
  case Float32MixedArray:
  case Float64MixedArray:
LAB_005945e2:
    bVar3 = IR::Opnd::IsRegOpnd((Opnd *)dstVal);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar18 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1592,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar18 = 0;
    }
    bVar3 = DoFloatTypeSpec(this);
    if (!bVar3) {
      if (_newMax == (Value *)0x0) {
        if (instr == (Instr **)0x0) {
          _newMax = NewGenericValue(this,(ValueType)src._6_2_,(Opnd *)dstVal);
        }
        else {
          _newMax = ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,(Value *)instr);
        }
      }
      return _newMax;
    }
    bVar3 = IsLoopPrePass(this);
    if (!bVar3) {
      bVar3 = IR::Instr::HasBailOutInfo((Instr *)dst->_vptr_Opnd);
      if (bVar3) {
        BVar7 = IR::Instr::GetBailOutKind((Instr *)dst->_vptr_Opnd);
        BVar8 = IR::operator~(BailOutKindBits);
        BVar8 = IR::operator&(BVar7,BVar8);
        bVar3 = IR::operator!(BVar8);
        if (bVar3) {
LAB_0059475f:
          BVar8 = IR::operator&(BVar7,BailOutKindBits);
          BVar9 = IR::operator|(BailOutOnArrayAccessHelperCall,BailOutMarkTempObject);
          BVar9 = IR::operator~(BVar9);
          BVar8 = IR::operator&(BVar8,BVar9);
          bVar3 = IR::operator!(BVar8);
          if (!bVar3) goto LAB_005947a3;
        }
        else {
          BVar8 = IR::operator~(BailOutKindBits);
          BVar8 = IR::operator&(BVar7,BVar8);
          if (BVar8 == BailOutOnImplicitCallsPreOp) goto LAB_0059475f;
LAB_005947a3:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x15af,
                             "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                             ,
                             "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 0;
        }
        if (oldBailOutKind == BailOutConventionalTypedArrayAccessOnly) {
          pIVar1 = (Instr *)dst->_vptr_Opnd;
          BVar8 = IR::operator-(BailOutKindBits,BailOutOnArrayAccessHelperCall);
          BVar7 = IR::operator&(BVar7,BVar8);
          BVar7 = IR::operator|(BailOutConventionalTypedArrayAccessOnly,BVar7);
          IR::Instr::SetBailOutKind(pIVar1,BVar7);
        }
        else {
          if (oldBailOutKind != BailOutConventionalNativeArrayAccessOnly) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar18 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x15bc,
                               "(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                               "bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar18 = 0;
          }
          pIVar1 = (Instr *)dst->_vptr_Opnd;
          BVar7 = IR::operator|(BVar7,oldBailOutKind);
          IR::Instr::SetBailOutKind(pIVar1,BVar7);
        }
      }
      else {
        GenerateBailAtOperation(this,(Instr **)dst,oldBailOutKind);
      }
    }
    TypeSpecializeFloatDst
              (this,(Instr *)dst->_vptr_Opnd,(Value *)0x0,(Value *)0x0,(Value *)0x0,
               (Value **)&newMax);
    local_1cb = '\n';
    goto LAB_00594a86;
  default:
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_6a.field_0);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar18 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x15ca,"(baseValueType.IsLikelyNativeArray())",
                         "baseValueType.IsLikelyNativeArray()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar18 = 0;
    }
    oldBailOutKind = BailOutConventionalNativeArrayAccessOnly;
    bVar3 = ValueType::HasIntElements((ValueType *)&local_6a.field_0);
    if (!bVar3) {
      bVar3 = ValueType::HasFloatElements((ValueType *)&local_6a.field_0);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x15d0,"(baseValueType.HasFloatElements())",
                           "baseValueType.HasFloatElements()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 0;
      }
      goto LAB_005945e2;
    }
LAB_00594202:
    srcValueInfo._4_4_ = -0x80000000;
    srcValueInfo._0_4_ = 0x7fffffff;
  }
  bVar3 = IR::Opnd::IsRegOpnd((Opnd *)dstVal);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1553,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 0;
  }
  bVar3 = DoAggressiveIntTypeSpec(this);
  if ((!bVar3) && (bVar3 = DoFloatTypeSpec(this), !bVar3)) {
    if (_newMax == (Value *)0x0) {
      if (instr == (Instr **)0x0) {
        _newMax = NewGenericValue(this,(ValueType)src._6_2_,(Opnd *)dstVal);
      }
      else {
        _newMax = ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,(Value *)instr);
      }
    }
    return _newMax;
  }
  bVar3 = IsLoopPrePass(this);
  if (!bVar3) {
    bVar3 = IR::Instr::HasBailOutInfo((Instr *)dst->_vptr_Opnd);
    if (bVar3) {
      BVar7 = IR::Instr::GetBailOutKind((Instr *)dst->_vptr_Opnd);
      BVar8 = IR::operator~(BailOutKindBits);
      BVar8 = IR::operator&(BVar7,BVar8);
      bVar3 = IR::operator!(BVar8);
      if (bVar3) {
LAB_0059439d:
        BVar8 = IR::operator&(BVar7,BailOutKindBits);
        BVar9 = IR::operator|(BailOutOnArrayAccessHelperCall,BailOutMarkTempObject);
        BVar9 = IR::operator~(BVar9);
        BVar8 = IR::operator&(BVar8,BVar9);
        bVar3 = IR::operator!(BVar8);
        if (!bVar3) goto LAB_005943e1;
      }
      else {
        BVar8 = IR::operator~(BailOutKindBits);
        BVar8 = IR::operator&(BVar7,BVar8);
        if (BVar8 == BailOutOnImplicitCallsPreOp) goto LAB_0059439d;
LAB_005943e1:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1571,
                           "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                           ,
                           "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 0;
      }
      if (oldBailOutKind == BailOutConventionalTypedArrayAccessOnly) {
        pIVar1 = (Instr *)dst->_vptr_Opnd;
        BVar8 = IR::operator-(BailOutKindBits,BailOutOnArrayAccessHelperCall);
        BVar7 = IR::operator&(BVar7,BVar8);
        BVar7 = IR::operator|(BailOutConventionalTypedArrayAccessOnly,BVar7);
        IR::Instr::SetBailOutKind(pIVar1,BVar7);
      }
      else {
        if (oldBailOutKind != BailOutConventionalNativeArrayAccessOnly) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x157e,"(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)"
                             ,"bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 0;
        }
        pIVar1 = (Instr *)dst->_vptr_Opnd;
        BVar7 = IR::operator|(BVar7,oldBailOutKind);
        IR::Instr::SetBailOutKind(pIVar1,BVar7);
      }
    }
    else {
      GenerateBailAtOperation(this,(Instr **)dst,oldBailOutKind);
    }
  }
  TypeSpecializeIntDst
            (this,(Instr *)dst->_vptr_Opnd,*(OpCode *)(dst->_vptr_Opnd + 6),(Value *)0x0,
             (Value *)0x0,(Value *)0x0,oldBailOutKind,srcValueInfo._4_4_,(int32)srcValueInfo,
             (Value **)&newMax,(AddSubConstantInfo *)0x0);
  local_1cb = '\x03';
LAB_00594a86:
  if (_newMax == (Value *)0x0) {
    _newMax = NewGenericValue(this,(ValueType)src._6_2_,(Opnd *)dstVal);
  }
  if (local_1cb == '\x17') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x15d9,"(toType != TyVar)","toType != TyVar");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 0;
  }
  uVar5 = Func::GetSourceContextId(this->func);
  uVar6 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar5,uVar6);
  if (bVar3) {
    Output::Print(L"TRACE ");
    bVar3 = IsLoopPrePass(this);
    if (bVar3) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized array access.\n");
    IR::Instr::Dump((Instr *)dst->_vptr_Opnd);
    Output::Flush();
  }
  uVar5 = Func::GetSourceContextId(this->func);
  uVar6 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar5,uVar6);
  if (bVar3) {
    ValueType::ToString((ValueType *)&local_6a.field_0,(char (*) [256])(dstValTypeStr + 0xf8));
    this_00 = ::Value::GetValueInfo(_newMax);
    this_01 = ValueInfo::Type(this_00);
    ValueType::ToString(this_01,(char (*) [256])local_438);
    pJVar14 = Func::GetJITFunctionBody(this->func);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar16 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])(baseValueTypeStr_1 + 0xf8));
    pcVar17 = Js::OpCodeUtil::GetOpCodeName(*(OpCode *)(dst->_vptr_Opnd + 6));
    pcVar19 = L"float64";
    if (local_1cb == '\x03') {
      pcVar19 = L"int32";
    }
    Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"
                  ,pcVar15,pcVar16,pcVar17,dstValTypeStr + 0xf8,pcVar19,local_438);
    Output::Print(L" (");
    ::Value::Dump(_newMax);
    Output::Print(L").\n");
    Output::Flush();
  }
  return _newMax;
}

Assistant:

Value *
GlobOpt::ValueNumberLdElemDst(IR::Instr **pInstr, Value *srcVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    int32 newMin, newMax;
    ValueInfo *srcValueInfo = (srcVal ? srcVal->GetValueInfo() : nullptr);

    ValueType profiledElementType;
    if (instr->IsProfiledInstr())
    {
        profiledElementType = instr->AsProfiledInstr()->u.ldElemInfo->GetElementType();
        if(!(profiledElementType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) &&
            srcVal &&
            srcValueInfo->IsUninitialized())
        {
            if(IsLoopPrePass())
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
            else
            {
                // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                // can improve the original value type.
                srcValueInfo->Type() = profiledElementType;
                instr->GetSrc1()->SetValueType(profiledElementType);
            }
        }
    }
    
    IR::IndirOpnd *src = instr->GetSrc1()->AsIndirOpnd();
    const ValueType baseValueType(src->GetBaseOpnd()->GetValueType());
    if (instr->DoStackArgsOpt() ||
        !(
            baseValueType.IsLikelyOptimizedTypedArray() ||
            (baseValueType.IsLikelyNativeArray() && instr->IsProfiledInstr()) // Specialized native array lowering for LdElem requires that it is profiled.
        ) ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||

        // Don't do type spec on native array with a history of accessing gaps, as this is a bailout
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !ShouldExpectConventionalArrayIndexValue(src))
    {
        if(DoTypedArrayTypeSpec() && !IsLoopPrePass())
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because %s.\n"),
                    this->func->GetJITFunctionBody()->GetDisplayName(),
                    this->func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                    baseValueTypeStr,
                    instr->DoStackArgsOpt() ? _u("instruction uses the arguments object") :
                    baseValueType.IsLikelyOptimizedTypedArray() ? _u("index is negative or likely not int") : _u("of array type"));
                Output::Flush();
            }
        }

        if(!dstVal)
        {
            if(srcVal)
            {
                dstVal = this->ValueNumberTransferDst(instr, srcVal);
            }
            else
            {
                dstVal = NewGenericValue(profiledElementType, dst);
            }
        }
        return dstVal;
    }

    Assert(instr->GetSrc1()->IsIndirOpnd());

    IRType toType = TyVar;
    IR::BailOutKind bailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Int8MixedArray:
        newMin = Int8ConstMin;
        newMax = Int8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint8Array:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        newMin = Uint8ConstMin;
        newMax = Uint8ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int16Array:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Int16MixedArray:
        newMin = Int16ConstMin;
        newMax = Int16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Uint16Array:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Uint16MixedArray:
        newMin = Uint16ConstMin;
        newMax = Uint16ConstMax;
        goto IntArrayCommon;

    case ObjectType::Int32Array:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int32MixedArray:
    case ObjectType::Uint32Array: // int-specialized loads from uint32 arrays will bail out on values that don't fit in an int32
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
    Int32Array:
        newMin = Int32ConstMin;
        newMax = Int32ConstMax;
        goto IntArrayCommon;

    IntArrayCommon:
        Assert(dst->IsRegOpnd());

        // If int type spec is disabled, it is ok to load int values as they can help float type spec, and merging int32 with float64 => float64.
        // But if float type spec is also disabled, we'll have problems because float64 merged with var => float64...
        if (!this->DoAggressiveIntTypeSpec() && !this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, bailOutKind, newMin, newMax, &dstVal);
        toType = TyInt32;
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64Array:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
        Assert(dst->IsRegOpnd());

        // If float type spec is disabled, don't load float64 values
        if (!this->DoFloatTypeSpec())
        {
            if (!dstVal)
            {
                if (srcVal)
                {
                    dstVal = this->ValueNumberTransferDst(instr, srcVal);
                }
                else
                {
                    dstVal = NewGenericValue(profiledElementType, dst);
                }
            }
            return dstVal;
        }

        if (!this->IsLoopPrePass())
        {
            if (instr->HasBailOutInfo())
            {
                const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                Assert(
                    (
                        !(oldBailOutKind & ~IR::BailOutKindBits) ||
                        (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                    !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                if (bailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                    // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                    // bails out for the right reason.
                    instr->SetBailOutKind(
                        bailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                }
                else
                {
                    // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                    // calls to occur, so it must be merged in to eliminate generating the helper call
                    Assert(bailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                    instr->SetBailOutKind(oldBailOutKind | bailOutKind);
                }
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
            }
        }
        TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, &dstVal);
        toType = TyFloat64;
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        bailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if(!dstVal)
    {
        dstVal = NewGenericValue(profiledElementType, dst);
    }

    Assert(toType != TyVar);

    GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
    if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        baseValueType.ToString(baseValueTypeStr);
        char dstValTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
        dstVal->GetValueInfo()->Type().ToString(dstValTypeStr);
        Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s producing %S"),
            this->func->GetJITFunctionBody()->GetDisplayName(),
            this->func->GetDebugNumberSet(debugStringBuffer),
            Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
            baseValueTypeStr,
            toType == TyInt32 ? _u("int32") : _u("float64"),
            dstValTypeStr);
#if DBG_DUMP
        Output::Print(_u(" ("));
        dstVal->Dump();
        Output::Print(_u(").\n"));
#else
        Output::Print(_u(".\n"));
#endif
        Output::Flush();
    }

    return dstVal;
}